

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O2

void __thiscall tcu::App::cleanup(App *this,EVP_PKEY_CTX *ctx)

{
  TestSessionExecutor *this_00;
  TestContext *pTVar1;
  
  this_00 = this->m_testExecutor;
  if (this_00 != (TestSessionExecutor *)0x0) {
    TestSessionExecutor::~TestSessionExecutor(this_00);
  }
  operator_delete(this_00,0xa8);
  if (this->m_testRoot != (TestPackageRoot *)0x0) {
    (*(this->m_testRoot->super_TestNode)._vptr_TestNode[1])();
  }
  pTVar1 = this->m_testCtx;
  if (pTVar1 != (TestContext *)0x0) {
    std::__cxx11::string::~string((string *)&pTVar1->m_testResultDesc);
  }
  operator_delete(pTVar1,0x60);
  if (this->m_crashHandler != (qpCrashHandler *)0x0) {
    qpCrashHandler_destroy(this->m_crashHandler);
  }
  if (this->m_watchDog != (qpWatchDog *)0x0) {
    qpWatchDog_destroy(this->m_watchDog);
    return;
  }
  return;
}

Assistant:

void App::cleanup (void)
{
	delete m_testExecutor;
	delete m_testRoot;
	delete m_testCtx;

	if (m_crashHandler)
		qpCrashHandler_destroy(m_crashHandler);

	if (m_watchDog)
		qpWatchDog_destroy(m_watchDog);
}